

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::writeBasis
          (SPxBasisBase<double> *this,ostream *os,NameSet *rowNames,NameSet *colNames,bool cpxFormat
          )

{
  SPxStatus SVar1;
  int iVar2;
  Status SVar3;
  Type TVar4;
  _Setw _Var5;
  ostream *poVar6;
  char *pcVar7;
  Desc *in_RSI;
  SPxBasisBase<double> *in_RDI;
  byte in_R8B;
  int col;
  int row;
  char buf [255];
  ostream *in_stack_fffffffffffffe98;
  Desc *in_stack_fffffffffffffea0;
  NameSet *in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  int i;
  int in_stack_fffffffffffffeb8;
  int iVar8;
  int local_130;
  int local_12c;
  
  std::ios_base::setf((ios_base *)in_stack_fffffffffffffea0,
                      (fmtflags)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  std::operator<<((ostream *)in_RSI,"NAME  soplex.bas\n");
  SVar1 = status(in_RDI);
  if (SVar1 == NO_PROBLEM) {
    poVar6 = std::operator<<((ostream *)in_RSI,"ENDATA");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_12c = 0;
    local_130 = 0;
    while (iVar8 = local_130, iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25e73a),
          iVar8 < iVar2) {
      SVar3 = Desc::colStatus(in_stack_fffffffffffffea0,
                              (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      if (SVar3 < D_FREE) {
        SVar3 = Desc::colStatus(in_stack_fffffffffffffea0,
                                (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        if (SVar3 == P_ON_UPPER) {
          in_stack_fffffffffffffe98 = std::operator<<((ostream *)in_RSI," UL ");
          pcVar7 = getColName<double>((SPxLPBase<double> *)CONCAT44(iVar8,in_stack_fffffffffffffeb8)
                                      ,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                      in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
          poVar6 = std::operator<<(in_stack_fffffffffffffe98,pcVar7);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        while( true ) {
          in_stack_fffffffffffffeb8 = local_12c;
          iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x25e77e);
          i = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
          if (iVar2 <= in_stack_fffffffffffffeb8) break;
          SVar3 = Desc::rowStatus(in_stack_fffffffffffffea0,
                                  (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
          i = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
          if (SVar3 < ~P_FREE) break;
          local_12c = local_12c + 1;
        }
        SVar3 = Desc::rowStatus(in_stack_fffffffffffffea0,
                                (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        if ((SVar3 == P_ON_UPPER) &&
           (((in_R8B & 1) == 0 ||
            (TVar4 = LPRowSetBase<double>::type
                               ((LPRowSetBase<double> *)CONCAT44(iVar8,in_stack_fffffffffffffeb8),i)
            , TVar4 == RANGE)))) {
          std::operator<<((ostream *)in_RSI," XU ");
        }
        else {
          std::operator<<((ostream *)in_RSI," XL ");
        }
        in_stack_fffffffffffffea0 = in_RSI;
        _Var5 = std::setw(8);
        in_stack_fffffffffffffea8 =
             (NameSet *)std::operator<<((ostream *)in_stack_fffffffffffffea0,_Var5);
        pcVar7 = getColName<double>((SPxLPBase<double> *)CONCAT44(iVar8,in_stack_fffffffffffffeb8),i
                                    ,in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
        std::operator<<((ostream *)in_stack_fffffffffffffea8,pcVar7);
        in_stack_fffffffffffffeb0 = std::operator<<((ostream *)in_RSI,"       ");
        pcVar7 = getRowName<double>((SPxLPBase<double> *)CONCAT44(iVar8,in_stack_fffffffffffffeb8),
                                    (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                    in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
        poVar6 = std::operator<<(in_stack_fffffffffffffeb0,pcVar7);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_12c = local_12c + 1;
      }
      local_130 = local_130 + 1;
    }
    poVar6 = std::operator<<((ostream *)in_RSI,"ENDATA");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::writeBasis(
   std::ostream&  os,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool cpxFormat
) const
{
   assert(theLP != nullptr);

   os.setf(std::ios::left);
   os << "NAME  soplex.bas\n";

   /* do not write basis if there is none */
   if(status() == NO_PROBLEM)
   {
      os << "ENDATA" << std::endl;
      return;
   }

   /* start writing */
   char buf[255];
   int row = 0;

   for(int col = 0; col < theLP->nCols(); col++)
   {
      if(thedesc.colStatus(col) > 0)
      {
         /* Find non basic row */
         for(; row < theLP->nRows(); row++)
         {
            if(thedesc.rowStatus(row) < 0)
               break;
         }

         assert(row != theLP->nRows());

         if(thedesc.rowStatus(row) == Desc::P_ON_UPPER && (!cpxFormat
               || theLP->LPRowSetBase<R>::type(row) == LPRowBase<R>::RANGE))
            os << " XU ";
         else
            os << " XL ";

         os << std::setw(8) << getColName(theLP, col, colNames, buf);

         /* break in two parts since buf is reused */
         os << "       "
            << getRowName(theLP, row, rowNames, buf)
            << std::endl;

         row++;
      }
      else
      {
         if(thedesc.colStatus(col) == Desc::P_ON_UPPER)
         {
            os << " UL "
               << getColName(theLP, col, colNames, buf)
               << std::endl;
         }
         else
         {
            /* Default is all non-basic variables on lower bound (if finite) or at zero (if free).
             * nothing to do in this case.
             */
            assert(thedesc.colStatus(col) == Desc::P_ON_LOWER
                   || thedesc.colStatus(col) == Desc::P_FIXED
                   || thedesc.colStatus(col) == Desc::P_FREE);
            assert(thedesc.colStatus(col) == Desc::P_FREE || theLP->lower(col) > R(-infinity));
            assert(thedesc.colStatus(col) != Desc::P_FREE || theLP->lower(col) <= 0);
         }
      }
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());

   // Check that we covered all nonbasic rows - the remaining should be basic.
   for(; row < theLP->nRows(); row++)
   {
      if(thedesc.rowStatus(row) < 0)
         break;
   }

   assert(row == theLP->nRows());

#endif // NDEBUG

   os << "ENDATA" << std::endl;
}